

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void ibfR4(float *ioptr,long M,long NDiffU)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  long lVar14;
  ulong in_RDX;
  byte in_SIL;
  float *in_RDI;
  unsigned_long NSameU;
  unsigned_long pnexti;
  unsigned_long pnext;
  unsigned_long pinc;
  unsigned_long posi;
  unsigned_long pos;
  float local_b4;
  float local_b0;
  float local_ac;
  float local_a8;
  float local_9c;
  float local_98;
  float local_84;
  float Two;
  float t1i;
  float t1r;
  float f7i;
  float f7r;
  float f6i;
  float f6r;
  float f5i;
  float f5r;
  float f4i;
  float f4r;
  float f3i;
  float f3r;
  float f2i;
  float f2r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float w1r;
  float *p3r;
  float *p2r;
  float *p1r;
  float *p0r;
  float *pstrt;
  unsigned_long SameUCnt;
  
  lVar14 = in_RDX * 8 + 1;
  _f3r = ((ulong)(1L << (in_SIL & 0x3f)) >> 2) / in_RDX;
  _f6r = in_RDI + in_RDX * 2;
  _f7r = _f6r + in_RDX * 2;
  _t1r = _f7r + in_RDX * 2;
  local_a8 = *in_RDI - *_f6r;
  local_ac = in_RDI[1] - _f6r[1];
  Two = *in_RDI + *_f6r;
  local_84 = in_RDI[1] + _f6r[1];
  local_b0 = *_f7r + *_t1r;
  local_b4 = _f7r[1] + _t1r[1];
  local_98 = *_f7r - *_t1r;
  local_9c = _f7r[1] - _t1r[1];
  _f5r = in_RDI;
  while (_f3r = _f3r - 1, _f3r != 0) {
    fVar1 = _f7r[2];
    fVar2 = _f7r[3];
    fVar3 = _f6r[2];
    fVar4 = _f6r[3];
    fVar5 = _t1r[3];
    fVar6 = _f5r[2];
    fVar7 = _t1r[2];
    fVar8 = _f5r[3];
    *_t1r = local_a8 + local_9c;
    *_f5r = Two + local_b0;
    _t1r[1] = local_ac - local_98;
    _f5r[1] = local_84 + local_b4;
    *_f6r = local_a8 - local_9c;
    *_f7r = Two - local_b0;
    _f6r[1] = local_ac + local_98;
    _f7r[1] = local_84 - local_b4;
    fVar9 = fVar1 + fVar5;
    fVar10 = fVar2 - fVar7;
    fVar1 = fVar1 - fVar5;
    fVar2 = fVar2 + fVar7;
    fVar11 = fVar6 - fVar4;
    fVar7 = fVar8 + fVar3;
    fVar6 = fVar6 + fVar4;
    fVar8 = fVar8 - fVar3;
    fVar12 = (fVar6 - fVar9 * 0.70710677) - fVar10 * 0.70710677;
    fVar10 = (fVar8 + fVar9 * 0.70710677) - fVar10 * 0.70710677;
    fVar9 = (fVar11 - fVar1 * 0.70710677) + fVar2 * 0.70710677;
    fVar13 = (fVar7 - fVar1 * 0.70710677) - fVar2 * 0.70710677;
    fVar1 = _t1r[in_RDX * 8];
    fVar2 = _f5r[in_RDX * 8];
    fVar3 = _t1r[lVar14];
    local_84 = _f5r[lVar14];
    local_98 = _f7r[in_RDX * 8];
    local_9c = _f7r[lVar14];
    fVar4 = _f6r[in_RDX * 8];
    fVar5 = _f6r[lVar14];
    _f7r[2] = fVar9;
    _f6r[2] = fVar12;
    _f7r[3] = fVar13;
    _f6r[3] = fVar10;
    _t1r[2] = fVar6 * 2.0 - fVar12;
    _f5r[2] = fVar11 * 2.0 - fVar9;
    _t1r[3] = fVar8 * 2.0 - fVar10;
    _f5r[3] = fVar7 * 2.0 - fVar13;
    local_b0 = local_98 + fVar1;
    local_b4 = local_9c + fVar3;
    local_98 = local_98 - fVar1;
    local_9c = local_9c - fVar3;
    local_a8 = fVar2 - fVar4;
    local_ac = local_84 - fVar5;
    Two = fVar2 + fVar4;
    local_84 = local_84 + fVar5;
    _t1r = _t1r + in_RDX * 8;
    _f5r = _f5r + in_RDX * 8;
    _f6r = _f6r + in_RDX * 8;
    _f7r = _f7r + in_RDX * 8;
  }
  fVar1 = _f7r[2];
  fVar2 = _f7r[3];
  fVar3 = _f6r[2];
  fVar4 = _f6r[3];
  fVar5 = _t1r[3];
  fVar6 = _f5r[2];
  fVar7 = _t1r[2];
  fVar8 = _f5r[3];
  *_t1r = local_a8 + local_9c;
  *_f5r = Two + local_b0;
  _t1r[1] = local_ac - local_98;
  _f5r[1] = local_84 + local_b4;
  *_f6r = local_a8 - local_9c;
  *_f7r = Two - local_b0;
  _f6r[1] = local_ac + local_98;
  _f7r[1] = local_84 - local_b4;
  fVar9 = fVar1 + fVar5;
  fVar10 = fVar2 - fVar7;
  fVar1 = fVar1 - fVar5;
  fVar2 = fVar2 + fVar7;
  fVar7 = fVar6 - fVar4;
  fVar5 = fVar8 + fVar3;
  fVar6 = fVar6 + fVar4;
  fVar8 = fVar8 - fVar3;
  fVar4 = (fVar6 - fVar9 * 0.70710677) - fVar10 * 0.70710677;
  fVar9 = (fVar8 + fVar9 * 0.70710677) - fVar10 * 0.70710677;
  fVar3 = (fVar7 - fVar1 * 0.70710677) + fVar2 * 0.70710677;
  fVar1 = (fVar5 - fVar1 * 0.70710677) - fVar2 * 0.70710677;
  _f7r[2] = fVar3;
  _f6r[2] = fVar4;
  _f7r[3] = fVar1;
  _f6r[3] = fVar9;
  _t1r[2] = fVar6 * 2.0 - fVar4;
  _f5r[2] = fVar7 * 2.0 - fVar3;
  _t1r[3] = fVar8 * 2.0 - fVar9;
  _f5r[3] = fVar5 * 2.0 - fVar1;
  return;
}

Assistant:

static inline void ibfR4(float *ioptr, long M, long NDiffU){
/*** 1 radix 4 stage ***/
unsigned long	pos;
unsigned long	posi;
unsigned long	pinc;
unsigned long	pnext;
unsigned long	pnexti;
unsigned long 	NSameU;
unsigned long 	SameUCnt;

float	*pstrt;
float 	*p0r, *p1r, *p2r, *p3r;

float w1r = 1.0/MYROOT2; /* cos(pi/4)	*/
float f0r, f0i, f1r, f1i, f2r, f2i, f3r, f3i;
float f4r, f4i, f5r, f5i, f6r, f6i, f7r, f7i;
float t1r, t1i;
const float Two = 2.0;

pinc = NDiffU * 2;		// 2 floats per complex
pnext =  pinc * 4;
pnexti =  pnext + 1;
pos = 2;
posi = pos+1;
NSameU = POW2(M) / 4 /NDiffU;	// 4 pts per butterfly
pstrt = ioptr;
p0r = pstrt;
p1r = pstrt+pinc;
p2r = p1r+pinc;
p3r = p2r+pinc;

		/* Butterflys		*/
		/*
		f0	-	-	f0	-	-	f4
		f1	-  1 -	f5	-	-	f5
		f2	-	-	f6	-  1 -	f6
		f3	-  1 -	f3	- -i -	f7
		*/
		/* Butterflys		*/
		/*
		f0	-	-	f4	-	-	f4
		f1	- -i -	t1	-	-	f5
		f2	-	-	f2	- w1 -	f6
		f3	- -i -	f7	- iw1-	f7
		*/

f0r = *p0r;
f1r = *p1r;
f2r = *p2r;
f3r = *p3r;
f0i = *(p0r + 1);
f1i = *(p1r + 1);
f2i = *(p2r + 1);
f3i = *(p3r + 1);

f5r = f0r - f1r;
f5i = f0i - f1i;
f0r = f0r + f1r;
f0i = f0i + f1i;

f6r = f2r + f3r;
f6i = f2i + f3i;
f3r = f2r - f3r;
f3i = f2i - f3i;

for (SameUCnt = NSameU-1; SameUCnt > 0 ; SameUCnt--){

	f7r = f5r + f3i;
	f7i = f5i - f3r;
	f5r = f5r - f3i;
	f5i = f5i + f3r;

	f4r = f0r + f6r;
	f4i = f0i + f6i;
	f6r = f0r - f6r;
	f6i = f0i - f6i;

	f2r = *(p2r + pos);
	f2i = *(p2r + posi);
	f1r = *(p1r + pos);
	f1i = *(p1r + posi);
	f3i = *(p3r + posi);
	f0r = *(p0r + pos);
	f3r = *(p3r + pos);
	f0i = *(p0r + posi);

	*p3r = f7r;
	*p0r = f4r;
	*(p3r + 1) = f7i;
	*(p0r + 1) = f4i;
	*p1r = f5r;
	*p2r = f6r;
	*(p1r + 1) = f5i;
	*(p2r + 1) = f6i;

	f7r = f2r + f3i;
	f7i = f2i - f3r;
	f2r = f2r - f3i;
	f2i = f2i + f3r;

	f4r = f0r - f1i;
	f4i = f0i + f1r;
	t1r = f0r + f1i;
	t1i = f0i - f1r;

	f5r = t1r - f7r * w1r - f7i * w1r;
	f5i = t1i + f7r * w1r - f7i * w1r;
	f7r = t1r * Two - f5r;
	f7i = t1i * Two - f5i;

	f6r = f4r - f2r * w1r + f2i * w1r;
	f6i = f4i - f2r * w1r - f2i * w1r;
	f4r = f4r * Two - f6r;
	f4i = f4i * Two - f6i;

	f3r = *(p3r + pnext);
	f0r = *(p0r + pnext);
	f3i = *(p3r + pnexti);
	f0i = *(p0r + pnexti);
	f2r = *(p2r + pnext);
	f2i = *(p2r + pnexti);
	f1r = *(p1r + pnext);
	f1i = *(p1r + pnexti);

	*(p2r + pos) = f6r;
	*(p1r + pos) = f5r;
	*(p2r + posi) = f6i;
	*(p1r + posi) = f5i;
	*(p3r + pos) = f7r;
	*(p0r + pos) = f4r;
	*(p3r + posi) = f7i;
	*(p0r + posi) = f4i;

	f6r = f2r + f3r;
	f6i = f2i + f3i;
	f3r = f2r - f3r;
	f3i = f2i - f3i;

	f5r = f0r - f1r;
	f5i = f0i - f1i;
	f0r = f0r + f1r;
	f0i = f0i + f1i;

	p3r += pnext;
	p0r += pnext;
	p1r += pnext;
	p2r += pnext;

}
f7r = f5r + f3i;
f7i = f5i - f3r;
f5r = f5r - f3i;
f5i = f5i + f3r;

f4r = f0r + f6r;
f4i = f0i + f6i;
f6r = f0r - f6r;
f6i = f0i - f6i;

f2r = *(p2r + pos);
f2i = *(p2r + posi);
f1r = *(p1r + pos);
f1i = *(p1r + posi);
f3i = *(p3r + posi);
f0r = *(p0r + pos);
f3r = *(p3r + pos);
f0i = *(p0r + posi);

*p3r = f7r;
*p0r = f4r;
*(p3r + 1) = f7i;
*(p0r + 1) = f4i;
*p1r = f5r;
*p2r = f6r;
*(p1r + 1) = f5i;
*(p2r + 1) = f6i;

f7r = f2r + f3i;
f7i = f2i - f3r;
f2r = f2r - f3i;
f2i = f2i + f3r;

f4r = f0r - f1i;
f4i = f0i + f1r;
t1r = f0r + f1i;
t1i = f0i - f1r;

f5r = t1r - f7r * w1r - f7i * w1r;
f5i = t1i + f7r * w1r - f7i * w1r;
f7r = t1r * Two - f5r;
f7i = t1i * Two - f5i;

f6r = f4r - f2r * w1r + f2i * w1r;
f6i = f4i - f2r * w1r - f2i * w1r;
f4r = f4r * Two - f6r;
f4i = f4i * Two - f6i;

*(p2r + pos) = f6r;
*(p1r + pos) = f5r;
*(p2r + posi) = f6i;
*(p1r + posi) = f5i;
*(p3r + pos) = f7r;
*(p0r + pos) = f4r;
*(p3r + posi) = f7i;
*(p0r + posi) = f4i;

}